

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.h
# Opt level: O0

bool __thiscall Assimp::FBX::Video::operator<(Video *this,Video *other)

{
  bool bVar1;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  Video *local_18;
  Video *other_local;
  Video *this_local;
  
  local_18 = other;
  other_local = this;
  std::tie<std::__cxx11::string_const,std::__cxx11::string_const,std::__cxx11::string_const>
            (&local_30,&this->type,&this->relativeFileName,&this->fileName);
  std::tie<std::__cxx11::string_const,std::__cxx11::string_const,std::__cxx11::string_const>
            (&local_48,&local_18->type,&local_18->relativeFileName,&local_18->fileName);
  bVar1 = std::operator<(&local_30,&local_48);
  return bVar1;
}

Assistant:

bool operator<(const Video& other) const
    {
        return std::tie(type, relativeFileName, fileName) < std::tie(other.type, other.relativeFileName, other.fileName);
    }